

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O2

void innalg(double *vec,int l,int N,double *v,double *theta)

{
  int iVar1;
  long lVar2;
  double *acov;
  long lVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  
  lVar2 = (long)N;
  acov = (double *)malloc(lVar2 * 8 + 8);
  autocovar(vec,l,acov,N + 1U);
  *v = *acov;
  pdVar4 = theta;
  for (lVar3 = 0; lVar3 <= lVar2; lVar3 = lVar3 + 1) {
    for (uVar6 = 0; N + 1U != uVar6; uVar6 = uVar6 + 1) {
      pdVar4[uVar6] = 0.0;
    }
    pdVar4 = pdVar4 + lVar2 + 1;
  }
  iVar1 = 0;
  if (0 < N) {
    iVar1 = N;
  }
  iVar9 = N + 2;
  iVar5 = iVar9;
  for (uVar6 = 1; uVar6 != iVar1 + 1; uVar6 = uVar6 + 1) {
    iVar7 = 0;
    for (lVar2 = 0; uVar6 - lVar2 != 0; lVar2 = lVar2 + 1) {
      dVar10 = 0.0;
      pdVar4 = v;
      for (lVar3 = 0; lVar2 + lVar3 != 0; lVar3 = lVar3 + -1) {
        dVar10 = dVar10 + theta[iVar7 + lVar3] * theta[iVar5 + (int)lVar3] * *pdVar4;
        pdVar4 = pdVar4 + 1;
      }
      theta[(int)uVar6 * iVar9 - (int)lVar2] = (acov[uVar6 - lVar2] - dVar10) / v[lVar2];
      iVar7 = iVar7 + iVar9;
    }
    dVar10 = 0.0;
    iVar7 = iVar5;
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      dVar10 = dVar10 + v[uVar8] * theta[iVar7] * theta[iVar7];
      iVar7 = iVar7 + -1;
    }
    v[uVar6] = *v - dVar10;
    iVar5 = iVar5 + iVar9;
  }
  free(acov);
  return;
}

Assistant:

void innalg(double *vec, int l, int N,double *v, double *theta) {
	int i,j,lag,ct,ct2,index1,index2;
	double temp,temp2;
	double *acov;
	// IMPORTANT - The program does not store the matrix as laid out
	// in Brockwell and Davis

	// theta is a (N+1)X(N+1) matrix so choose the value of N accordingly. The recommended
	// value is N = 17 which will make theta a 18*18 double vector so allocate memory
	// accordingly.

	// theta11 is accessed at theta[1*(N+1) + 1]

	// with thetaxy accessed at theta[x*(N+1)+y]

	// The coefficients of Moving Average MA(q) are stored at
	// theta[N*(N+1)+1+i] where i = 0,1,2,...,q-1. Multiply these entries by -1.0
	// to get the MA(q) coefficients.

	// Output v is a 1X(N+1) vector with v[0] = autocovariance at lag 0.

	// see ma_inn function below

	lag = N+1;

	acov = (double*) malloc(sizeof(double) * lag);
	autocovar(vec,l,acov,lag);
	//mdisplay(acov,1,lag);
	v[0] = acov[0];

	for(i = 0; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < lag;++j) {
			theta[index1+j] = 0.0;
		}
	}

	for(i = 1; i < lag;++i) {
		index1 = i * lag;
		for(j = 0; j < i;++j) {
			index2 = j * lag;
			temp = 0.0;
			for(ct = 0; ct < j;++ct) {
				temp += (theta[index2 + j - ct] * theta[index1 + i - ct]* v[ct]);
			}
			theta[index1 + i - j] = (acov[i-j]-temp)*1.0/v[j];
		}
		temp2 = 0.0;

		for(ct2 = 0; ct2 < i;++ct2) {
			temp2 += (v[ct2]*theta[index1 + i - ct2]*theta[index1 + i - ct2]);
		}

		v[i]=v[0]-temp2;
	}


	free(acov);
}